

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O2

void __thiscall Imf_3_4::Image::shiftPixels(Image *this,int dx,int dy)

{
  Box2i BVar1;
  long lVar2;
  long *plVar3;
  _Rb_tree_node_base *p_Var4;
  ostream *poVar5;
  ArgExc *pAVar6;
  long lVar7;
  int y;
  long lVar8;
  int x;
  long lVar9;
  stringstream _iex_throw_s;
  ostream local_1a8 [376];
  
  p_Var4 = (this->_channels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var4 == &(this->_channels)._M_t._M_impl.super__Rb_tree_header) {
      BVar1 = this->_dataWindow;
      (this->_dataWindow).min.x = dx + BVar1.min.x;
      (this->_dataWindow).min.y = dy + BVar1.min.y;
      (this->_dataWindow).max.x = dx + BVar1.max.x;
      (this->_dataWindow).max.y = dy + BVar1.max.y;
      lVar7 = 0;
      for (lVar8 = 0; lVar8 < (this->_levels)._sizeX; lVar8 = lVar8 + 1) {
        for (lVar9 = 0; lVar2 = (this->_levels)._sizeY, lVar9 < lVar2; lVar9 = lVar9 + 1) {
          plVar3 = *(long **)((long)(this->_levels)._data + lVar9 * 8 + lVar2 * lVar7);
          if (plVar3 != (long *)0x0) {
            (**(code **)(*plVar3 + 0x18))(plVar3,dx,dy);
          }
        }
        lVar7 = lVar7 + 8;
      }
      return;
    }
    if (dx % *(int *)&p_Var4[2].field_0x4 != 0) break;
    if (dy % *(int *)&p_Var4[2]._M_parent != 0) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
      poVar5 = std::operator<<(local_1a8,"Cannot shift image vertically by ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,dy);
      poVar5 = std::operator<<(poVar5,
                               " pixels.  The shift distance must be a multiple of the y sampling rate of all channels, but the y sampling rate channel "
                              );
      poVar5 = std::operator<<(poVar5,(string *)(p_Var4 + 1));
      poVar5 = std::operator<<(poVar5," is ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(int *)&p_Var4[2]._M_parent);
      std::operator<<(poVar5,".");
      pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar6,(stringstream *)&_iex_throw_s);
      __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar5 = std::operator<<(local_1a8,"Cannot shift image horizontally by ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,dx);
  poVar5 = std::operator<<(poVar5,
                           " pixels.  The shift distance must be a multiple of the x sampling rate of all channels, but the x sampling rate channel "
                          );
  poVar5 = std::operator<<(poVar5,(string *)(p_Var4 + 1));
  poVar5 = std::operator<<(poVar5," is ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(int *)&p_Var4[2].field_0x4);
  std::operator<<(poVar5,".");
  pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(pAVar6,(stringstream *)&_iex_throw_s);
  __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
Image::shiftPixels (int dx, int dy)
{
    for (ChannelMap::iterator i = _channels.begin (); i != _channels.end ();
         ++i)
    {
        if (dx % i->second.xSampling != 0)
        {
            THROW (
                ArgExc,
                "Cannot shift image horizontally by "
                    << dx
                    << " "
                       "pixels.  The shift distance must be a multiple "
                       "of the x sampling rate of all channels, but the "
                       "x sampling rate channel "
                    << i->first
                    << " "
                       "is "
                    << i->second.xSampling << ".");
        }

        if (dy % i->second.ySampling != 0)
        {
            THROW (
                ArgExc,
                "Cannot shift image vertically by "
                    << dy
                    << " "
                       "pixels.  The shift distance must be a multiple "
                       "of the y sampling rate of all channels, but the "
                       "y sampling rate channel "
                    << i->first
                    << " "
                       "is "
                    << i->second.ySampling << ".");
        }
    }

    _dataWindow.min.x += dx;
    _dataWindow.min.y += dy;
    _dataWindow.max.x += dx;
    _dataWindow.max.y += dy;

    for (int y = 0; y < _levels.height (); ++y)
        for (int x = 0; x < _levels.width (); ++x)
            if (_levels[y][x]) _levels[y][x]->shiftPixels (dx, dy);
}